

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle_settings.cpp
# Opt level: O1

void __thiscall
cornelich::vanilla_chronicle_settings::vanilla_chronicle_settings
          (vanilla_chronicle_settings *this,string *path)

{
  int32_t iVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  pcVar2 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + path->_M_string_length);
  this->m_thread_id_bits = 0x10;
  this->m_cycle_length = 86400000;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x220);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0018c8d0;
  iVar1 = this->m_cycle_length;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__cycle_formatter_0018c980;
  p_Var3[1]._M_use_count = iVar1;
  memset(p_Var3 + 2,0,0x200);
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__cycle_formatter_0018cc08;
  (this->m_cycle_format).super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var3 + 1);
  (this->m_cycle_format).super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  this->m_entries_per_cycle = 0x10000000000;
  this->m_index_block_size = 0x1000000;
  this->m_data_block_size = 0x4000000;
  this->m_index_cache_size = 8;
  this->m_data_cache_size = 0x10;
  return;
}

Assistant:

vanilla_chronicle_settings::vanilla_chronicle_settings(const std::string & path)
    : m_path(path)
    , m_thread_id_bits(DEFAULT_THREAD_ID_BITS)
    , m_cycle_length(24 * 60 * 60 * 1000) // MILLIS_PER_DAY
    , m_cycle_format(std::make_shared<cycle_formatter_yyyymmdd>(m_cycle_length))
    , m_entries_per_cycle(1ULL << 40)
    , m_index_block_size(16ULL << 20) // 16MB
    , m_data_block_size(64ULL << 20) // 64MB
    , m_index_cache_size(8)
    , m_data_cache_size(16)
{
}